

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O2

char ** apprun_shell_split_arguments(char *str)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  char **ppcVar4;
  char *pcVar5;
  ushort **ppuVar6;
  char *pcVar7;
  char buffer [1024];
  ulong local_448;
  char local_438 [1032];
  
  if (str == (char *)0x0) {
    return (char **)0x0;
  }
  local_448 = 0;
  sVar3 = strlen(str);
  ppcVar4 = (char **)calloc(sVar3 + 1,8);
  do {
    memset(local_438,0,0x400);
    do {
      if (*str == '\0') {
        return ppcVar4;
      }
      pcVar5 = apprun_string_consume_spaces(str);
      cVar1 = *pcVar5;
      if (cVar1 == '\"') {
        pcVar7 = "\"";
LAB_001068ba:
        pcVar7 = apprun_string_consume_until(pcVar5 + 1,pcVar7);
        strncat(local_438,pcVar5 + 1,(size_t)(pcVar7 + ~(ulong)pcVar5));
        str = pcVar7 + 1;
      }
      else {
        if (cVar1 == '\'') {
          pcVar7 = "\'";
          goto LAB_001068ba;
        }
        if (cVar1 == '\\') {
          strncat(local_438,pcVar5 + 1,1);
          str = pcVar5 + 2;
        }
        else {
          str = apprun_string_consume_until(pcVar5,"\"\'\\ \t");
          strncat(local_438,pcVar5,(long)str - (long)pcVar5);
        }
      }
      ppuVar6 = __ctype_b_loc();
    } while (((long)*str != 0) && (((*ppuVar6)[*str] & 0x2000) == 0));
    _Var2 = apprun_string_is_all_blanks(local_438);
    if (!_Var2) {
      pcVar5 = apprun_string_trim(local_438);
      ppcVar4[local_448] = pcVar5;
      local_448 = (ulong)((int)local_448 + 1);
    }
  } while( true );
}

Assistant:

char **apprun_shell_split_arguments(char const *str) {
    if (str == NULL)
        return NULL;

    static const char single_quote_delimiter[] = "\'";
    static const char double_quote_delimiter[] = "\"";
    static const char regular_quote_delimiter[] = "\"\'\\ \t";

    char **splits = calloc(strlen(str) + 1, sizeof(char *));
    unsigned split_count = 0;

    const char *begin = str;
    const char *end = str;
    char buffer[1024] = {0x0};

    while (*begin != '\0') {
        begin = apprun_string_consume_spaces(begin);
        bool consumed = false;

        if (*begin == '\\') {
            strncat(buffer, begin + 1, 1);
            end = begin + 2;
            consumed = true;
        }

        if (!consumed && *begin == '\'') {
            end = apprun_string_consume_until(begin + 1, single_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin == '\"') {
            end = apprun_string_consume_until(begin + 1, double_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin != '\'' && *begin != '\"' && *begin != '\\') {
            end = apprun_string_consume_until(begin, regular_quote_delimiter);
            strncat(buffer, begin, end - begin);
        }

        if (isspace(*end) || *end == 0) {
            if (!apprun_string_is_all_blanks(buffer)) {
                splits[split_count] = apprun_string_trim(buffer);
                split_count++;
            }

            memset(buffer, 0, 1024);
        }

        begin = end;
    }

    return splits;
}